

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3_test_control(int op,...)

{
  sqlite3_mutex **ppsVar1;
  uint uVar2;
  sqlite3 *db;
  char *pcVar3;
  char in_AL;
  byte bVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  void *pvVar8;
  size_t sVar9;
  Bitvec *p;
  void *pvVar10;
  undefined8 in_RCX;
  char *in_RDX;
  ulong uVar11;
  u64 n;
  uint uVar12;
  undefined8 in_RSI;
  sqlite3PrngType *__src;
  sqlite3PrngType *__dest;
  sqlite3_mutex *psVar13;
  undefined8 in_R8;
  undefined8 in_R9;
  uint uVar14;
  ulong uVar15;
  bool bVar16;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  int id;
  uint local_fc;
  void *local_f8;
  Bitvec *local_f0;
  sqlite3 *local_e0;
  char *local_d8;
  void *local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  pvVar10 = local_d0;
  pcVar3 = local_d8;
  db = local_e0;
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  uVar14 = 0;
  uVar12 = (uint)local_e0;
  iVar5 = (int)local_d8;
  uVar6 = 0;
  local_d0 = (void *)in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  switch(op) {
  case 5:
    __dest = &sqlite3SavedPrng;
    __src = &sqlite3Prng;
    goto LAB_0011c915;
  case 6:
    __dest = &sqlite3Prng;
    __src = &sqlite3SavedPrng;
LAB_0011c915:
    local_e0 = (sqlite3 *)in_RSI;
    local_d8 = in_RDX;
    memcpy(__dest,__src,0x103);
    uVar6 = uVar14;
    break;
  case 7:
    local_e0 = (sqlite3 *)in_RSI;
    local_d8 = in_RDX;
    sqlite3_randomness(0,(void *)0x0);
    uVar6 = 0;
    break;
  case 8:
    local_e0 = (sqlite3 *)in_RSI;
    local_d8 = in_RDX;
    p = (Bitvec *)sqlite3Malloc(0x200);
    if (p != (Bitvec *)0x0) {
      memset(p,0,0x200);
      p->iSize = uVar12;
    }
    iVar5 = uVar12 + 0xe;
    if (-1 < (int)(uVar12 + 7)) {
      iVar5 = uVar12 + 7;
    }
    n = (u64)((iVar5 >> 3) + 1);
    pvVar10 = sqlite3Malloc(n);
    if (pvVar10 != (void *)0x0) {
      memset(pvVar10,0,n);
    }
    iVar5 = sqlite3_initialize();
    if (iVar5 == 0) {
      pvVar8 = sqlite3Malloc(0x200);
    }
    else {
      pvVar8 = (void *)0x0;
    }
    uVar6 = 0xffffffff;
    if ((pvVar8 != (void *)0x0 && p != (Bitvec *)0x0) && pvVar10 != (void *)0x0) {
      uVar15 = 0;
      local_f8 = pvVar8;
      local_f0 = p;
      do {
        while( true ) {
          p = local_f0;
          uVar6 = *(uint *)((long)pcVar3 + uVar15 * 4);
          if ((uVar6 - 1 < 2) || (uVar6 == 5)) {
            iVar5 = *(int *)((long)pcVar3 + uVar15 * 4 + 8);
            local_fc = iVar5 - 1;
            *(int *)((long)pcVar3 + uVar15 * 4 + 8) =
                 iVar5 + *(int *)((long)pcVar3 + uVar15 * 4 + 0xc);
            iVar5 = 4;
          }
          else {
            if (uVar6 == 0) {
              iVar5 = sqlite3BitvecTestNotNull(local_f0,uVar12 + 1);
              iVar7 = sqlite3BitvecTestNotNull(p,0);
              uVar14 = (((p->iSize - uVar12) - (uint)(iVar5 == 0)) + 2) - (uint)(iVar7 == 0);
              local_fc = 1;
              pvVar8 = local_f8;
              uVar6 = uVar14;
              if ((int)uVar12 < 1) goto LAB_0011d051;
              goto LAB_0011d00a;
            }
            sqlite3_randomness(4,&local_fc);
            iVar5 = 2;
          }
          iVar7 = *(int *)((long)pcVar3 + uVar15 * 4 + 4);
          if (1 < iVar7) {
            iVar5 = 0;
          }
          *(int *)((long)pcVar3 + uVar15 * 4 + 4) = iVar7 + -1;
          local_fc = (uint)((long)(ulong)(local_fc & 0x7fffffff) % (long)(int)uVar12);
          uVar15 = (ulong)(uint)(iVar5 + (int)uVar15);
          uVar11 = (ulong)(local_fc + 1 >> 3);
          bVar4 = (byte)(1 << ((byte)(local_fc + 1) & 7));
          if ((uVar6 & 1) != 0) break;
          *(byte *)((long)pvVar10 + uVar11) = *(byte *)((long)pvVar10 + uVar11) & ~bVar4;
          sqlite3BitvecClear(local_f0,local_fc + 1,local_f8);
        }
        *(byte *)((long)pvVar10 + uVar11) = *(byte *)((long)pvVar10 + uVar11) | bVar4;
      } while ((uVar6 == 5) || (iVar5 = sqlite3BitvecSet(local_f0,local_fc + 1), iVar5 == 0));
      pvVar8 = local_f8;
      p = local_f0;
      uVar6 = 0xffffffff;
    }
    goto LAB_0011d051;
  case 9:
    sqlite3Config.xTestCallback = (_func_int_int *)local_e0;
    uVar6 = uVar14;
    if (local_e0 != (sqlite3 *)0x0) {
      local_e0 = (sqlite3 *)in_RSI;
      local_d8 = in_RDX;
      uVar6 = (*(code *)db)(0);
    }
    break;
  case 10:
    sqlite3Hooks_0 = local_e0;
    sqlite3Hooks_1 = (undefined8 *)local_d8;
    uVar6 = uVar14;
    break;
  case 0xb:
    uVar6 = sqlite3PendingByte;
    if ((uint)local_e0 != 0) {
      uVar6 = sqlite3PendingByte;
      sqlite3PendingByte = (uint)local_e0;
    }
    break;
  case 0xc:
    uVar6 = 0;
    break;
  case 0xd:
    uVar6 = (uint)local_e0;
    break;
  case 0xe:
    ppsVar1 = &local_e0->mutex;
    local_e0 = (sqlite3 *)in_RSI;
    local_d8 = in_RDX;
    if (*ppsVar1 != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(*ppsVar1);
    }
    sqlite3BtreeSetPageSize(db->aDb->pBt,0,iVar5,0);
    psVar13 = db->mutex;
    goto LAB_0011ce6c;
  case 0xf:
    local_e0->dbOptFlags = (u16)local_d8;
    uVar6 = uVar14;
    break;
  case 0x10:
    uVar12 = 0;
    bVar16 = local_e0 != (sqlite3 *)0x0;
    local_e0 = (sqlite3 *)in_RSI;
    local_d8 = in_RDX;
    if (bVar16) {
      sVar9 = strlen((char *)db);
      uVar12 = (uint)sVar9 & 0x3fffffff;
    }
    local_fc = 0x37;
    keywordCode((char *)db,uVar12,(int *)&local_fc);
    uVar6 = 0x7c;
    if (local_fc == 0x37) {
      uVar6 = 0;
    }
    break;
  case 0x11:
    bVar16 = (uint)local_e0 != 0;
    local_e0 = (sqlite3 *)in_RSI;
    local_d8 = in_RDX;
    if (bVar16) {
      pvVar8 = sqlite3ScratchMalloc(uVar12);
      *(void **)pcVar3 = pvVar8;
    }
    sqlite3ScratchFree(pvVar10);
    uVar6 = uVar14;
    break;
  case 0x12:
    sqlite3Config.bLocaltimeFault = (uint)local_e0;
    uVar6 = uVar14;
    break;
  case 0x13:
    sqlite3Config.iOnceResetThreshold = (uint)local_e0;
    uVar6 = uVar14;
    break;
  case 0x14:
    sqlite3Config.neverCorrupt = (uint)local_e0;
    uVar6 = uVar14;
    break;
  case 0x16:
    uVar6 = 0x1e212;
    break;
  case 0x17:
    uVar6 = (uint)(sqlite3Config.isInit == 0);
    break;
  case 0x18:
    local_e0->nMaxSorterMmap = (int)local_d8;
    break;
  case 0x19:
    ppsVar1 = &local_e0->mutex;
    local_e0 = (sqlite3 *)in_RSI;
    local_d8 = in_RDX;
    if (*ppsVar1 != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(*ppsVar1);
    }
    iVar5 = sqlite3FindDbName(db,local_d8);
    (db->init).iDb = (u8)iVar5;
    (db->init).imposterTable = (u8)local_d0;
    (db->init).busy = (u8)local_d0;
    (db->init).newTnum = (int)local_c8;
    if (((db->init).busy == '\0') && (0 < (int)local_c8)) {
      sqlite3ResetAllSchemasOfConnection(db);
    }
    psVar13 = db->mutex;
LAB_0011ce6c:
    uVar6 = 0;
    if (psVar13 != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(psVar13);
    }
  }
  return uVar6;
  while (local_fc = uVar2 + 1, uVar6 = uVar14, (1 - uVar12) + uVar2 != 1) {
LAB_0011d00a:
    uVar2 = local_fc;
    bVar4 = *(byte *)((long)pvVar10 + (ulong)(local_fc >> 3));
    iVar5 = sqlite3BitvecTestNotNull(p,local_fc);
    pvVar8 = local_f8;
    uVar6 = uVar2;
    if ((iVar5 == 0) == ((bVar4 >> (uVar2 & 7) & 1) != 0)) break;
  }
LAB_0011d051:
  sqlite3_free(pvVar8);
  sqlite3_free(pvVar10);
  sqlite3BitvecDestroy(p);
  return uVar6;
}

Assistant:

SQLITE_API int sqlite3_test_control(int op, ...){
  int rc = 0;
#ifdef SQLITE_UNTESTABLE
  UNUSED_PARAMETER(op);
#else
  va_list ap;
  va_start(ap, op);
  switch( op ){

    /*
    ** Save the current state of the PRNG.
    */
    case SQLITE_TESTCTRL_PRNG_SAVE: {
      sqlite3PrngSaveState();
      break;
    }

    /*
    ** Restore the state of the PRNG to the last state saved using
    ** PRNG_SAVE.  If PRNG_SAVE has never before been called, then
    ** this verb acts like PRNG_RESET.
    */
    case SQLITE_TESTCTRL_PRNG_RESTORE: {
      sqlite3PrngRestoreState();
      break;
    }

    /*
    ** Reset the PRNG back to its uninitialized state.  The next call
    ** to sqlite3_randomness() will reseed the PRNG using a single call
    ** to the xRandomness method of the default VFS.
    */
    case SQLITE_TESTCTRL_PRNG_RESET: {
      sqlite3_randomness(0,0);
      break;
    }

    /*
    **  sqlite3_test_control(BITVEC_TEST, size, program)
    **
    ** Run a test against a Bitvec object of size.  The program argument
    ** is an array of integers that defines the test.  Return -1 on a
    ** memory allocation error, 0 on success, or non-zero for an error.
    ** See the sqlite3BitvecBuiltinTest() for additional information.
    */
    case SQLITE_TESTCTRL_BITVEC_TEST: {
      int sz = va_arg(ap, int);
      int *aProg = va_arg(ap, int*);
      rc = sqlite3BitvecBuiltinTest(sz, aProg);
      break;
    }

    /*
    **  sqlite3_test_control(FAULT_INSTALL, xCallback)
    **
    ** Arrange to invoke xCallback() whenever sqlite3FaultSim() is called,
    ** if xCallback is not NULL.
    **
    ** As a test of the fault simulator mechanism itself, sqlite3FaultSim(0)
    ** is called immediately after installing the new callback and the return
    ** value from sqlite3FaultSim(0) becomes the return from
    ** sqlite3_test_control().
    */
    case SQLITE_TESTCTRL_FAULT_INSTALL: {
      /* MSVC is picky about pulling func ptrs from va lists.
      ** http://support.microsoft.com/kb/47961
      ** sqlite3GlobalConfig.xTestCallback = va_arg(ap, int(*)(int));
      */
      typedef int(*TESTCALLBACKFUNC_t)(int);
      sqlite3GlobalConfig.xTestCallback = va_arg(ap, TESTCALLBACKFUNC_t);
      rc = sqlite3FaultSim(0);
      break;
    }

    /*
    **  sqlite3_test_control(BENIGN_MALLOC_HOOKS, xBegin, xEnd)
    **
    ** Register hooks to call to indicate which malloc() failures 
    ** are benign.
    */
    case SQLITE_TESTCTRL_BENIGN_MALLOC_HOOKS: {
      typedef void (*void_function)(void);
      void_function xBenignBegin;
      void_function xBenignEnd;
      xBenignBegin = va_arg(ap, void_function);
      xBenignEnd = va_arg(ap, void_function);
      sqlite3BenignMallocHooks(xBenignBegin, xBenignEnd);
      break;
    }

    /*
    **  sqlite3_test_control(SQLITE_TESTCTRL_PENDING_BYTE, unsigned int X)
    **
    ** Set the PENDING byte to the value in the argument, if X>0.
    ** Make no changes if X==0.  Return the value of the pending byte
    ** as it existing before this routine was called.
    **
    ** IMPORTANT:  Changing the PENDING byte from 0x40000000 results in
    ** an incompatible database file format.  Changing the PENDING byte
    ** while any database connection is open results in undefined and
    ** deleterious behavior.
    */
    case SQLITE_TESTCTRL_PENDING_BYTE: {
      rc = PENDING_BYTE;
#ifndef SQLITE_OMIT_WSD
      {
        unsigned int newVal = va_arg(ap, unsigned int);
        if( newVal ) sqlite3PendingByte = newVal;
      }
#endif
      break;
    }

    /*
    **  sqlite3_test_control(SQLITE_TESTCTRL_ASSERT, int X)
    **
    ** This action provides a run-time test to see whether or not
    ** assert() was enabled at compile-time.  If X is true and assert()
    ** is enabled, then the return value is true.  If X is true and
    ** assert() is disabled, then the return value is zero.  If X is
    ** false and assert() is enabled, then the assertion fires and the
    ** process aborts.  If X is false and assert() is disabled, then the
    ** return value is zero.
    */
    case SQLITE_TESTCTRL_ASSERT: {
      volatile int x = 0;
      assert( /*side-effects-ok*/ (x = va_arg(ap,int))!=0 );
      rc = x;
      break;
    }


    /*
    **  sqlite3_test_control(SQLITE_TESTCTRL_ALWAYS, int X)
    **
    ** This action provides a run-time test to see how the ALWAYS and
    ** NEVER macros were defined at compile-time.
    **
    ** The return value is ALWAYS(X).  
    **
    ** The recommended test is X==2.  If the return value is 2, that means
    ** ALWAYS() and NEVER() are both no-op pass-through macros, which is the
    ** default setting.  If the return value is 1, then ALWAYS() is either
    ** hard-coded to true or else it asserts if its argument is false.
    ** The first behavior (hard-coded to true) is the case if
    ** SQLITE_TESTCTRL_ASSERT shows that assert() is disabled and the second
    ** behavior (assert if the argument to ALWAYS() is false) is the case if
    ** SQLITE_TESTCTRL_ASSERT shows that assert() is enabled.
    **
    ** The run-time test procedure might look something like this:
    **
    **    if( sqlite3_test_control(SQLITE_TESTCTRL_ALWAYS, 2)==2 ){
    **      // ALWAYS() and NEVER() are no-op pass-through macros
    **    }else if( sqlite3_test_control(SQLITE_TESTCTRL_ASSERT, 1) ){
    **      // ALWAYS(x) asserts that x is true. NEVER(x) asserts x is false.
    **    }else{
    **      // ALWAYS(x) is a constant 1.  NEVER(x) is a constant 0.
    **    }
    */
    case SQLITE_TESTCTRL_ALWAYS: {
      int x = va_arg(ap,int);
      rc = ALWAYS(x);
      break;
    }

    /*
    **   sqlite3_test_control(SQLITE_TESTCTRL_BYTEORDER);
    **
    ** The integer returned reveals the byte-order of the computer on which
    ** SQLite is running:
    **
    **       1     big-endian,    determined at run-time
    **      10     little-endian, determined at run-time
    **  432101     big-endian,    determined at compile-time
    **  123410     little-endian, determined at compile-time
    */ 
    case SQLITE_TESTCTRL_BYTEORDER: {
      rc = SQLITE_BYTEORDER*100 + SQLITE_LITTLEENDIAN*10 + SQLITE_BIGENDIAN;
      break;
    }

    /*   sqlite3_test_control(SQLITE_TESTCTRL_RESERVE, sqlite3 *db, int N)
    **
    ** Set the nReserve size to N for the main database on the database
    ** connection db.
    */
    case SQLITE_TESTCTRL_RESERVE: {
      sqlite3 *db = va_arg(ap, sqlite3*);
      int x = va_arg(ap,int);
      sqlite3_mutex_enter(db->mutex);
      sqlite3BtreeSetPageSize(db->aDb[0].pBt, 0, x, 0);
      sqlite3_mutex_leave(db->mutex);
      break;
    }

    /*  sqlite3_test_control(SQLITE_TESTCTRL_OPTIMIZATIONS, sqlite3 *db, int N)
    **
    ** Enable or disable various optimizations for testing purposes.  The 
    ** argument N is a bitmask of optimizations to be disabled.  For normal
    ** operation N should be 0.  The idea is that a test program (like the
    ** SQL Logic Test or SLT test module) can run the same SQL multiple times
    ** with various optimizations disabled to verify that the same answer
    ** is obtained in every case.
    */
    case SQLITE_TESTCTRL_OPTIMIZATIONS: {
      sqlite3 *db = va_arg(ap, sqlite3*);
      db->dbOptFlags = (u16)(va_arg(ap, int) & 0xffff);
      break;
    }

#ifdef SQLITE_N_KEYWORD
    /* sqlite3_test_control(SQLITE_TESTCTRL_ISKEYWORD, const char *zWord)
    **
    ** If zWord is a keyword recognized by the parser, then return the
    ** number of keywords.  Or if zWord is not a keyword, return 0.
    ** 
    ** This test feature is only available in the amalgamation since
    ** the SQLITE_N_KEYWORD macro is not defined in this file if SQLite
    ** is built using separate source files.
    */
    case SQLITE_TESTCTRL_ISKEYWORD: {
      const char *zWord = va_arg(ap, const char*);
      int n = sqlite3Strlen30(zWord);
      rc = (sqlite3KeywordCode((u8*)zWord, n)!=TK_ID) ? SQLITE_N_KEYWORD : 0;
      break;
    }
#endif 

    /* sqlite3_test_control(SQLITE_TESTCTRL_SCRATCHMALLOC, sz, &pNew, pFree);
    **
    ** Pass pFree into sqlite3ScratchFree(). 
    ** If sz>0 then allocate a scratch buffer into pNew.  
    */
    case SQLITE_TESTCTRL_SCRATCHMALLOC: {
      void *pFree, **ppNew;
      int sz;
      sz = va_arg(ap, int);
      ppNew = va_arg(ap, void**);
      pFree = va_arg(ap, void*);
      if( sz ) *ppNew = sqlite3ScratchMalloc(sz);
      sqlite3ScratchFree(pFree);
      break;
    }

    /*   sqlite3_test_control(SQLITE_TESTCTRL_LOCALTIME_FAULT, int onoff);
    **
    ** If parameter onoff is non-zero, configure the wrappers so that all
    ** subsequent calls to localtime() and variants fail. If onoff is zero,
    ** undo this setting.
    */
    case SQLITE_TESTCTRL_LOCALTIME_FAULT: {
      sqlite3GlobalConfig.bLocaltimeFault = va_arg(ap, int);
      break;
    }

    /*   sqlite3_test_control(SQLITE_TESTCTRL_NEVER_CORRUPT, int);
    **
    ** Set or clear a flag that indicates that the database file is always well-
    ** formed and never corrupt.  This flag is clear by default, indicating that
    ** database files might have arbitrary corruption.  Setting the flag during
    ** testing causes certain assert() statements in the code to be activated
    ** that demonstrat invariants on well-formed database files.
    */
    case SQLITE_TESTCTRL_NEVER_CORRUPT: {
      sqlite3GlobalConfig.neverCorrupt = va_arg(ap, int);
      break;
    }

    /* Set the threshold at which OP_Once counters reset back to zero.
    ** By default this is 0x7ffffffe (over 2 billion), but that value is
    ** too big to test in a reasonable amount of time, so this control is
    ** provided to set a small and easily reachable reset value.
    */
    case SQLITE_TESTCTRL_ONCE_RESET_THRESHOLD: {
      sqlite3GlobalConfig.iOnceResetThreshold = va_arg(ap, int);
      break;
    }

    /*   sqlite3_test_control(SQLITE_TESTCTRL_VDBE_COVERAGE, xCallback, ptr);
    **
    ** Set the VDBE coverage callback function to xCallback with context 
    ** pointer ptr.
    */
    case SQLITE_TESTCTRL_VDBE_COVERAGE: {
#ifdef SQLITE_VDBE_COVERAGE
      typedef void (*branch_callback)(void*,int,u8,u8);
      sqlite3GlobalConfig.xVdbeBranch = va_arg(ap,branch_callback);
      sqlite3GlobalConfig.pVdbeBranchArg = va_arg(ap,void*);
#endif
      break;
    }

    /*   sqlite3_test_control(SQLITE_TESTCTRL_SORTER_MMAP, db, nMax); */
    case SQLITE_TESTCTRL_SORTER_MMAP: {
      sqlite3 *db = va_arg(ap, sqlite3*);
      db->nMaxSorterMmap = va_arg(ap, int);
      break;
    }

    /*   sqlite3_test_control(SQLITE_TESTCTRL_ISINIT);
    **
    ** Return SQLITE_OK if SQLite has been initialized and SQLITE_ERROR if
    ** not.
    */
    case SQLITE_TESTCTRL_ISINIT: {
      if( sqlite3GlobalConfig.isInit==0 ) rc = SQLITE_ERROR;
      break;
    }

    /*  sqlite3_test_control(SQLITE_TESTCTRL_IMPOSTER, db, dbName, onOff, tnum);
    **
    ** This test control is used to create imposter tables.  "db" is a pointer
    ** to the database connection.  dbName is the database name (ex: "main" or
    ** "temp") which will receive the imposter.  "onOff" turns imposter mode on
    ** or off.  "tnum" is the root page of the b-tree to which the imposter
    ** table should connect.
    **
    ** Enable imposter mode only when the schema has already been parsed.  Then
    ** run a single CREATE TABLE statement to construct the imposter table in
    ** the parsed schema.  Then turn imposter mode back off again.
    **
    ** If onOff==0 and tnum>0 then reset the schema for all databases, causing
    ** the schema to be reparsed the next time it is needed.  This has the
    ** effect of erasing all imposter tables.
    */
    case SQLITE_TESTCTRL_IMPOSTER: {
      sqlite3 *db = va_arg(ap, sqlite3*);
      sqlite3_mutex_enter(db->mutex);
      db->init.iDb = sqlite3FindDbName(db, va_arg(ap,const char*));
      db->init.busy = db->init.imposterTable = va_arg(ap,int);
      db->init.newTnum = va_arg(ap,int);
      if( db->init.busy==0 && db->init.newTnum>0 ){
        sqlite3ResetAllSchemasOfConnection(db);
      }
      sqlite3_mutex_leave(db->mutex);
      break;
    }
  }
  va_end(ap);
#endif /* SQLITE_UNTESTABLE */
  return rc;
}